

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver
          (sysbvm_context_t *context,sysbvm_tuple_t chainMessageNode,sysbvm_tuple_t receiver,
          sysbvm_tuple_t receiverLookupType)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  
  _Var1 = sysbvm_astNode_isMessageChainMessageNode(context,chainMessageNode);
  if (!_Var1) {
    sysbvm_error("Expected a message chain message node.");
  }
  sVar2 = sysbvm_astMessageSendNode_create
                    (context,*(sysbvm_tuple_t *)(chainMessageNode + 0x10),receiver,
                     *(sysbvm_tuple_t *)(chainMessageNode + 0x28),
                     *(sysbvm_tuple_t *)(chainMessageNode + 0x30));
  *(sysbvm_tuple_t *)(sVar2 + 0x30) = receiverLookupType;
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver(sysbvm_context_t *context, sysbvm_tuple_t chainMessageNode, sysbvm_tuple_t receiver, sysbvm_tuple_t receiverLookupType)
{
    if(!sysbvm_astNode_isMessageChainMessageNode(context, chainMessageNode))
        sysbvm_error("Expected a message chain message node.");

    sysbvm_astMessageChainMessageNode_t *chainMessageNodeObject = (sysbvm_astMessageChainMessageNode_t*)chainMessageNode;
    sysbvm_astMessageSendNode_t *messageSendNode = (sysbvm_astMessageSendNode_t*)sysbvm_astMessageSendNode_create(context, chainMessageNodeObject->super.sourcePosition, receiver, chainMessageNodeObject->selector, chainMessageNodeObject->arguments);
    messageSendNode->receiverLookupType = receiverLookupType;
    return (sysbvm_tuple_t)messageSendNode;
}